

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VBufPack(N_Vector x,void *buf)

{
  undefined8 in_RSI;
  long in_RDI;
  int ier;
  undefined4 local_14;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x198) == 0) {
    local_14 = -1;
  }
  else {
    local_14 = (**(code **)(*(long *)(in_RDI + 8) + 0x198))(in_RDI,in_RSI);
  }
  return local_14;
}

Assistant:

int N_VBufPack(N_Vector x, void *buf)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));
  if (x->ops->nvbufpack == NULL)
    ier = -1;
  else
    ier = x->ops->nvbufpack(x, buf);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return(ier);
}